

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cinject.h
# Opt level: O2

shared_ptr<WaterPool> __thiscall
cinject::InstanceStorage<WaterPool,_cinject::ConstantFactory<WaterPool>_>::getInstance
          (InstanceStorage<WaterPool,_cinject::ConstantFactory<WaterPool>_> *this,
          InjectionContext *context)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  shared_ptr<WaterPool> sVar2;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var1;
  
  if (*(char *)&(context->componentStack_).
                super__Vector_base<cinject::component_type,_std::allocator<cinject::component_type>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage == '\0') {
    sVar2 = createInstance(this,context);
    _Var1 = sVar2.super___shared_ptr<WaterPool,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  }
  else {
    if (context[1].container_ == (Container *)0x0) {
      createInstance((InstanceStorage<WaterPool,_cinject::ConstantFactory<WaterPool>_> *)
                     &stack0xffffffffffffffd8,context);
      std::__shared_ptr<WaterPool,_(__gnu_cxx::_Lock_policy)2>::operator=
                ((__shared_ptr<WaterPool,_(__gnu_cxx::_Lock_policy)2> *)(context + 1),
                 (__shared_ptr<WaterPool,_(__gnu_cxx::_Lock_policy)2> *)&stack0xffffffffffffffd8);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&stack0xffffffffffffffe0);
    }
    std::__shared_ptr<WaterPool,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              ((__shared_ptr<WaterPool,_(__gnu_cxx::_Lock_policy)2> *)this,
               (__shared_ptr<WaterPool,_(__gnu_cxx::_Lock_policy)2> *)(context + 1));
    _Var1._M_pi = extraout_RDX;
  }
  sVar2.super___shared_ptr<WaterPool,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi = _Var1._M_pi;
  sVar2.super___shared_ptr<WaterPool,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)this;
  return (shared_ptr<WaterPool>)sVar2.super___shared_ptr<WaterPool,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

virtual std::shared_ptr<TImplementation> getInstance(InjectionContext* context)
    {
        if (!isSingleton_)
        {
            return createInstance(context);
        }

        if (instance_ == nullptr)
        {
            instance_ = createInstance(context);
        }

        return instance_;
    }